

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::WeightParams::MergeFrom(WeightParams *this,WeightParams *from)

{
  int iVar1;
  void *pvVar2;
  string *psVar3;
  string *psVar4;
  LogMessage *pLVar5;
  QuantizationParams *this_00;
  QuantizationParams *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x66d6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->floatvalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->floatvalue_,iVar1 + (this->floatvalue_).current_size_);
    memcpy(((this->floatvalue_).rep_)->elements + (this->floatvalue_).current_size_,
           ((from->floatvalue_).rep_)->elements,(long)(from->floatvalue_).current_size_ << 2);
    (this->floatvalue_).current_size_ =
         (this->floatvalue_).current_size_ + (from->floatvalue_).current_size_;
  }
  psVar3 = (from->float16value_).ptr_;
  if ((psVar3->_M_string_length != 0) && (psVar4 = (this->float16value_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->float16value_,psVar3)
      ;
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->rawvalue_).ptr_;
  if ((psVar3->_M_string_length != 0) && (psVar4 = (this->rawvalue_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->rawvalue_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->int8rawvalue_).ptr_;
  if ((psVar3->_M_string_length != 0) && (psVar4 = (this->int8rawvalue_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->int8rawvalue_,psVar3)
      ;
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  from_00 = from->quantization_;
  if (from_00 != (QuantizationParams *)0x0 &&
      from != (WeightParams *)&_WeightParams_default_instance_) {
    this_00 = this->quantization_;
    if (this_00 == (QuantizationParams *)0x0) {
      this_00 = (QuantizationParams *)operator_new(0x28);
      QuantizationParams::QuantizationParams(this_00);
      this->quantization_ = this_00;
      from_00 = from->quantization_;
    }
    if (from_00 == (QuantizationParams *)0x0) {
      from_00 = (QuantizationParams *)&_QuantizationParams_default_instance_;
    }
    QuantizationParams::MergeFrom(this_00,from_00);
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  return;
}

Assistant:

void WeightParams::MergeFrom(const WeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.WeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  floatvalue_.MergeFrom(from.floatvalue_);
  if (from.float16value().size() > 0) {

    float16value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.float16value_);
  }
  if (from.rawvalue().size() > 0) {

    rawvalue_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.rawvalue_);
  }
  if (from.int8rawvalue().size() > 0) {

    int8rawvalue_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.int8rawvalue_);
  }
  if (from.has_quantization()) {
    mutable_quantization()->::CoreML::Specification::QuantizationParams::MergeFrom(from.quantization());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
}